

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::MILSpec::Value_ImmediateValue::_InternalSerialize
          (Value_ImmediateValue *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  uVar2 = this->_oneof_case_[0];
  if (uVar2 == 1) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue>
                       (1,(this->value_).tensor_,puVar1,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 2) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::MILSpec::TupleValue>
                       (2,(this->value_).tuple_,puVar1,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 3) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::MILSpec::ListValue>
                       (3,(this->value_).list_,puVar1,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 4) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::MILSpec::DictionaryValue>
                       (4,(this->value_).dictionary_,puVar1,stream);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) == 0) {
    return target;
  }
  uVar3 = uVar3 & 0xfffffffffffffffc;
  puVar1 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar3 + 8),*(int *)(uVar3 + 0x10),target);
  return puVar1;
}

Assistant:

uint8_t* Value_ImmediateValue::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.Value.ImmediateValue)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.MILSpec.TensorValue tensor = 1;
  if (_internal_has_tensor()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::tensor(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TupleValue tuple = 2;
  if (_internal_has_tuple()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::tuple(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.ListValue list = 3;
  if (_internal_has_list()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::list(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.DictionaryValue dictionary = 4;
  if (_internal_has_dictionary()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        4, _Internal::dictionary(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.Value.ImmediateValue)
  return target;
}